

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplerng.c
# Opt level: O1

int simplerng_poisson_large(double lambda)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int unaff_EBX;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if ((simplerng_poisson_large::old_lambda != lambda) ||
     (NAN(simplerng_poisson_large::old_lambda) || NAN(lambda))) {
    dVar4 = lambda * 3.0;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    simplerng_poisson_large::beta = 3.141592653589793 / dVar4;
    simplerng_poisson_large::alpha = simplerng_poisson_large::beta * lambda;
    dVar4 = log(-3.36 / lambda + 0.767);
    dVar5 = log(simplerng_poisson_large::beta);
    simplerng_poisson_large::k = (dVar4 - lambda) - dVar5;
    simplerng_poisson_large::old_lambda = lambda;
  }
  do {
    iVar2 = rand();
    dVar4 = simplerng_poisson_large::alpha;
    dVar5 = log((1.0 - (double)iVar2 * 4.656612873077393e-10) /
                ((double)iVar2 * 4.656612873077393e-10));
    dVar5 = (dVar4 - dVar5) / simplerng_poisson_large::beta;
    dVar4 = floor(dVar5 + 0.5);
    iVar2 = (int)dVar4;
    if (iVar2 < 0) {
      bVar1 = false;
    }
    else {
      iVar3 = rand();
      dVar5 = simplerng_poisson_large::alpha - dVar5 * simplerng_poisson_large::beta;
      dVar4 = exp(dVar5);
      dVar6 = log(((double)iVar3 * 4.656612873077393e-10) / ((dVar4 + 1.0) * (dVar4 + 1.0)));
      dVar4 = simplerng_poisson_large::k;
      dVar7 = log(lambda);
      dVar8 = simplerng_logfactorial(iVar2);
      bVar1 = dVar6 + dVar5 <= (dVar7 * (double)iVar2 + dVar4) - dVar8;
      if (bVar1) {
        unaff_EBX = iVar2;
      }
    }
  } while (!bVar1);
  return unaff_EBX;
}

Assistant:

int simplerng_poisson_large(double lambda)
{
  /* "Rejection method PA" from "The Computer Generation of Poisson Random Variables" by A. C. Atkinson
     Journal of the Royal Statistical Society Series C (Applied Statistics) Vol. 28, No. 1. (1979)
     The article is on pages 29-35. The algorithm given here is on page 32. */
  static double beta, alpha, k;
  static double old_lambda = -999999.;

  if (lambda != old_lambda) {
    double c = 0.767 - 3.36/lambda;
    beta = PI/sqrt(3.0*lambda);
    alpha = beta*lambda;
    k = log(c) - lambda - log(beta);
    old_lambda = lambda;
  }

  for(;;) { /* forever */
    double u, x, v, y, temp, lhs, rhs;
    int n;

    u = simplerng_getuniform();
    x = (alpha - log((1.0 - u)/u))/beta;
    n = (int) floor(x + 0.5);
    if (n < 0) continue;

    v = simplerng_getuniform();
    y = alpha - beta*x;
    temp = 1.0 + exp(y);
    lhs = y + log(v/(temp*temp));
    rhs = k + n*log(lambda) - simplerng_logfactorial(n);
    if (lhs <= rhs) return n;
  }

}